

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_average.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::time_average
          (NavierStokesBase *this,Real *a_time_avg,Real *a_time_avg_fluct,Real *a_dt_avg,
          Real *dt_level)

{
  bool bVar1;
  int iVar2;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  FabArray<amrex::FArrayBox> *in_RDI;
  double *in_R8;
  int loc_compute_fluctuations;
  Array4<double> *S_avg_old;
  Array4<double> *S_avg;
  Array4<double> *S_state;
  Box *bx;
  MFIter mfi;
  MultiFab *Savg_old;
  MultiFab *Savg;
  MultiFab *Sstate;
  undefined8 in_stack_fffffffffffffd68;
  int lev;
  Amr *in_stack_fffffffffffffd70;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd97;
  FabArrayBase *in_stack_fffffffffffffd98;
  MFIter *in_stack_fffffffffffffda0;
  anon_class_216_6_cca98ccf *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  Box *in_stack_fffffffffffffdc0;
  MFIter *in_stack_fffffffffffffdd0;
  undefined1 auStack_200 [64];
  double local_1c0;
  double local_1b8;
  int local_1b0;
  int local_1a4;
  undefined1 local_1a0 [64];
  undefined1 *local_160;
  undefined1 local_158 [64];
  undefined1 *local_118;
  undefined1 local_110 [64];
  undefined1 *local_d0;
  undefined1 local_c4 [28];
  undefined1 *local_a8;
  MFIter local_a0;
  MultiFab *local_40;
  MFIter *local_38;
  MultiFab *local_30;
  double *local_20;
  double *local_18;
  double *local_10;
  
  *in_RCX = *in_RCX + *in_R8;
  lev = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar2 = amrex::Amr::levelSteps(in_stack_fffffffffffffd70,lev);
  if (iVar2 % avg_interval == 0) {
    local_30 = amrex::AmrLevel::get_new_data((AmrLevel *)in_stack_fffffffffffffd70,lev);
    local_38 = (MFIter *)amrex::AmrLevel::get_new_data((AmrLevel *)in_stack_fffffffffffffd70,lev);
    local_40 = amrex::AmrLevel::get_old_data((AmrLevel *)in_stack_fffffffffffffd70,lev);
    mfi_00 = local_38;
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)in_stack_fffffffffffffd97);
    while( true ) {
      bVar1 = amrex::MFIter::isValid(&local_a0);
      if (!bVar1) break;
      amrex::MFIter::tilebox(in_stack_fffffffffffffdd0);
      local_a8 = local_c4;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffd80,(MFIter *)in_RDI,(int)((ulong)mfi_00 >> 0x20));
      local_d0 = local_110;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_118 = local_158;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_160 = local_1a0;
      local_1a4 = compute_fluctuations;
      memcpy(&stack0xfffffffffffffd80,local_d0,0x3c);
      memcpy(&stack0xfffffffffffffdc0,local_118,0x3c);
      memcpy(auStack_200,local_160,0x3c);
      local_1c0 = *local_20;
      local_1b8 = *local_10;
      local_1b0 = local_1a4;
      amrex::
      ParallelFor<int,NavierStokesBase::time_average(double&,double&,double&,double_const&)::__0,void>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0);
      amrex::MFIter::operator++(&local_a0);
    }
    amrex::MFIter::~MFIter(mfi_00);
    *local_10 = *local_10 + *local_20;
    if (compute_fluctuations == 1) {
      *local_18 = *local_18 + *local_20;
    }
    else {
      *local_18 = 0.0;
    }
    *local_20 = 0.0;
  }
  return;
}

Assistant:

void
NavierStokesBase::time_average(amrex::Real&  a_time_avg, amrex::Real&  a_time_avg_fluct, amrex::Real&  a_dt_avg, const Real& dt_level)

{
  a_dt_avg = a_dt_avg + dt_level;

  if (parent->levelSteps(0)%avg_interval == 0)
  {
    MultiFab& Sstate = get_new_data(State_Type);
    MultiFab& Savg   = get_new_data(Average_Type); 
    MultiFab& Savg_old   = get_old_data(Average_Type);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Savg,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& S_state = Sstate.array(mfi,Xvel);
       auto const& S_avg   = Savg.array(mfi);
       auto const& S_avg_old   = Savg_old.array(mfi);
       int loc_compute_fluctuations = compute_fluctuations; //NavierStokesBase class cannot be accessed directly fron device

       amrex::ParallelFor(bx, BL_SPACEDIM, [S_state, S_avg, S_avg_old, a_dt_avg, a_time_avg, loc_compute_fluctuations]
       AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
       {
          S_avg(i,j,k,n) = S_avg_old(i,j,k,n) + a_dt_avg * S_state(i,j,k,n);
          S_avg_old(i,j,k,n) = S_avg(i,j,k,n);

          if (loc_compute_fluctuations == 1){
            amrex::Real vel_prime = S_state(i,j,k,n) - (S_avg(i,j,k,n)/(a_time_avg + a_dt_avg));
            S_avg(i,j,k,n+BL_SPACEDIM) = S_avg_old(i,j,k,n+BL_SPACEDIM) + a_dt_avg * vel_prime * vel_prime;
          }
          else{
            S_avg(i,j,k,n+BL_SPACEDIM) = 0.;
          }
          S_avg_old(i,j,k,n+BL_SPACEDIM) = S_avg(i,j,k,n+BL_SPACEDIM);
       });
    }

    a_time_avg = a_time_avg + a_dt_avg;
    if (compute_fluctuations == 1){
      a_time_avg_fluct = a_time_avg_fluct + a_dt_avg;
    }else{
      a_time_avg_fluct = 0.;
    }

    a_dt_avg = 0;

  }
}